

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduce.hpp
# Opt level: O1

void diy::
     reduce<void(*)(Block*,diy::ReduceProxy_const&,diy::RegularMergePartners_const&),diy::RegularMergePartners,diy::detail::ReduceNeverSkip>
               (Master *master,Assigner *assigner,RegularMergePartners *partners,
               _func_void_Block_ptr_ReduceProxy_ptr_RegularMergePartners_ptr **reduce,
               ReduceNeverSkip *skip)

{
  pointer pDVar1;
  int *piVar2;
  ulong uVar3;
  ulong uVar4;
  mapped_type *this;
  mapped_type *this_00;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  bool bVar10;
  vector<int,_std::allocator<int>_> incoming_gids;
  ulong local_1a8;
  _Any_data local_198;
  code *local_188;
  code *pcStack_180;
  _Any_data local_178;
  code *local_168;
  code *pcStack_160;
  int local_154;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_150;
  _func_void_Block_ptr_ReduceProxy_ptr_RegularMergePartners_ptr **local_148;
  Assigner *local_140;
  ReductionFunctor<Block,_diy::RegularMergePartners> local_138;
  ulong local_b0;
  int *local_a8;
  IncomingRoundMap *local_a0;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  local_148 = reduce;
  local_140 = assigner;
  local_150 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  local_150->_M_use_count = 1;
  local_150->_M_weak_count = 1;
  local_150->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001482b0;
  local_154 = master->expected_;
  if ((partners->super_RegularPartners).kvs_.
      super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      (partners->super_RegularPartners).kvs_.
      super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_1a8._0_4_ = 0;
    uVar7 = (uint)local_1a8;
  }
  else {
    local_a0 = &master->incoming_;
    local_a8 = &master->exchange_round_;
    uVar5 = 1;
    local_1a8 = 0;
    do {
      local_188 = (code *)0x0;
      pcStack_180 = (code *)0x0;
      local_198._M_unused._M_object =
           (_func_void_Block_ptr_ReduceProxy_ptr_RegularMergePartners_ptr *)0x0;
      local_198._8_8_ = 0;
      if (*local_148 != (_func_void_Block_ptr_ReduceProxy_ptr_RegularMergePartners_ptr *)0x0) {
        pcStack_180 = std::
                      _Function_handler<void_(Block_*,_const_diy::ReduceProxy_&,_const_diy::RegularMergePartners_&),_void_(*)(Block_*,_const_diy::ReduceProxy_&,_const_diy::RegularMergePartners_&)>
                      ::_M_invoke;
        local_188 = std::
                    _Function_handler<void_(Block_*,_const_diy::ReduceProxy_&,_const_diy::RegularMergePartners_&),_void_(*)(Block_*,_const_diy::ReduceProxy_&,_const_diy::RegularMergePartners_&)>
                    ::_M_manager;
        local_198._M_unused._0_8_ = (undefined8)*local_148;
      }
      uVar7 = (uint)local_1a8;
      detail::ReductionFunctor<Block,_diy::RegularMergePartners>::ReductionFunctor
                (&local_138,uVar7,(Callback *)&local_198,partners,local_140);
      local_168 = (code *)0x0;
      pcStack_160 = (code *)0x0;
      local_178._M_unused._M_object = (void *)0x0;
      local_178._8_8_ = 0;
      local_178._M_unused._M_object = operator_new(0x18);
      *(uint *)local_178._M_unused._0_8_ = uVar7;
      *(RegularMergePartners **)((long)local_178._M_unused._0_8_ + 8) = partners;
      pcStack_160 = std::
                    _Function_handler<bool_(int,_const_diy::Master_&),_diy::detail::SkipInactiveOr<diy::RegularMergePartners,_diy::detail::ReduceNeverSkip>_>
                    ::_M_invoke;
      local_168 = std::
                  _Function_handler<bool_(int,_const_diy::Master_&),_diy::detail::SkipInactiveOr<diy::RegularMergePartners,_diy::detail::ReduceNeverSkip>_>
                  ::_M_manager;
      Master::foreach<diy::detail::ReductionFunctor<Block,diy::RegularMergePartners>>
                (master,&local_138,(Skip *)&local_178);
      if (local_168 != (code *)0x0) {
        (*local_168)(&local_178,&local_178,__destroy_functor);
      }
      if (local_138.partners.super_RegularPartners.steps_.
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
          (pointer)0x0) {
        operator_delete(local_138.partners.super_RegularPartners.steps_.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_138.partners.super_RegularPartners.steps_.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_138.partners.super_RegularPartners.steps_.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_138.partners.super_RegularPartners.kvs_.
          super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_138.partners.super_RegularPartners.kvs_.
                        super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_138.partners.super_RegularPartners.kvs_.
                              super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_138.partners.super_RegularPartners.kvs_.
                              super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_138.partners.super_RegularPartners.divisions_.
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
          (pointer)0x0) {
        operator_delete(local_138.partners.super_RegularPartners.divisions_.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_138.partners.super_RegularPartners.divisions_.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_138.partners.super_RegularPartners.divisions_.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_138.reduce.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_138.reduce.super__Function_base._M_manager)
                  ((_Any_data *)&local_138.reduce,(_Any_data *)&local_138.reduce,__destroy_functor);
      }
      if (local_188 != (code *)0x0) {
        (*local_188)(&local_198,&local_198,__destroy_functor);
      }
      Master::execute(master);
      if ((int)((ulong)((long)(master->blocks_).elements_.
                              super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(master->blocks_).elements_.
                             super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 3) == 0) {
        iVar8 = 0;
      }
      else {
        local_b0 = (ulong)(uVar7 + 1);
        uVar6 = 0;
        iVar8 = 0;
        do {
          local_138._0_8_ = (pointer)0x0;
          local_138.reduce.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
          local_138.reduce.super__Function_base._M_functor._8_8_ = 0;
          RegularDecomposer<diy::Bounds<int>_>::gid_to_coords
                    ((master->gids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[(int)uVar6],(DivisionsVector *)&local_138,
                     (DivisionsVector *)partners);
          bVar10 = 0x7ffffffe < uVar7;
          if (uVar7 < 0x7fffffff) {
            pDVar1 = (partners->super_RegularPartners).kvs_.
                     super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            piVar2 = (partners->super_RegularPartners).steps_.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start;
            uVar9 = (long)*(int *)(local_138._0_8_ + (long)pDVar1->dim * 4) / (long)*piVar2;
            if ((int)((long)((ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 | uVar9 & 0xffffffff) %
                     (long)pDVar1->size) == 0) {
              uVar9 = 1;
              do {
                uVar4 = uVar9;
                if (uVar5 == uVar4) break;
                uVar3 = (long)*(int *)(local_138._0_8_ + (long)pDVar1[uVar4].dim * 4) /
                        (long)piVar2[uVar4];
                uVar9 = uVar4 + 1;
              } while ((int)((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff)
                            % (long)pDVar1[uVar4].size) == 0);
              bVar10 = local_b0 <= uVar4;
            }
            else {
              bVar10 = false;
            }
          }
          if ((pointer)local_138._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_138._0_8_,
                            local_138.reduce.super__Function_base._M_functor._8_8_ - local_138._0_8_
                           );
          }
          if (bVar10) {
            local_138._0_8_ = (pointer)0x0;
            local_138.reduce.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
            local_138.reduce.super__Function_base._M_functor._8_8_ = 0;
            RegularPartners::fill
                      (&partners->super_RegularPartners,uVar7,
                       (master->gids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[(int)uVar6],
                       (vector<int,_std::allocator<int>_> *)&local_138);
            uVar9 = (long)local_138.reduce.super__Function_base._M_functor._M_unused._0_8_ -
                    local_138._0_8_;
            local_198._0_4_ =
                 (master->gids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[(int)uVar6];
            this = std::
                   map<int,_diy::Master::IncomingRound,_std::less<int>,_std::allocator<std::pair<const_int,_diy::Master::IncomingRound>_>_>
                   ::operator[](local_a0,local_a8);
            this_00 = std::
                      map<int,_diy::concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>,_std::less<int>,_std::allocator<std::pair<const_int,_diy::concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>_>_>
                      ::operator[](&this->map,(key_type *)local_198._M_pod_data);
            concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
            ::clear(this_00);
            if ((pointer)local_138._0_8_ != (pointer)0x0) {
              operator_delete((void *)local_138._0_8_,
                              local_138.reduce.super__Function_base._M_functor._8_8_ -
                              local_138._0_8_);
            }
            iVar8 = iVar8 + (int)(uVar9 >> 2);
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 < (uint)((ulong)((long)(master->blocks_).elements_.
                                              super__Vector_base<void_*,_std::allocator<void_*>_>.
                                              _M_impl.super__Vector_impl_data._M_finish -
                                       (long)(master->blocks_).elements_.
                                             super__Vector_base<void_*,_std::allocator<void_*>_>.
                                             _M_impl.super__Vector_impl_data._M_start) >> 3));
      }
      master->expected_ = iVar8;
      local_98._M_unused._M_object = (void *)0x0;
      local_98._8_8_ = 0;
      pcStack_80 = std::
                   _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
                   ::_M_invoke;
      local_88 = std::
                 _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
                 ::_M_manager;
      local_78._M_unused._M_object = (void *)0x0;
      local_78._8_8_ = 0;
      pcStack_60 = std::
                   _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
                   ::_M_invoke;
      local_68 = std::
                 _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
                 ::_M_manager;
      local_58._M_unused._M_object = (void *)0x0;
      local_58._8_8_ = 0;
      pcStack_40 = std::
                   _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
                   ::_M_invoke;
      local_48 = std::
                 _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
                 ::_M_manager;
      Master::flush(master,false,(MemoryManagement *)&local_98);
      if (local_48 != (code *)0x0) {
        (*local_48)(&local_58,&local_58,__destroy_functor);
      }
      if (local_68 != (code *)0x0) {
        (*local_68)(&local_78,&local_78,__destroy_functor);
      }
      if (local_88 != (code *)0x0) {
        (*local_88)(&local_98,&local_98,__destroy_functor);
      }
      local_1a8 = (ulong)(uVar7 + 1);
      uVar5 = uVar5 + 1;
      uVar7 = uVar7 + 1;
    } while (local_1a8 <
             (ulong)((long)(partners->super_RegularPartners).kvs_.
                           super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(partners->super_RegularPartners).kvs_.
                           super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  local_1a8._0_4_ = uVar7;
  local_188 = (code *)0x0;
  pcStack_180 = (code *)0x0;
  local_198._M_unused._M_object =
       (_func_void_Block_ptr_ReduceProxy_ptr_RegularMergePartners_ptr *)0x0;
  local_198._8_8_ = 0;
  if (*local_148 != (_func_void_Block_ptr_ReduceProxy_ptr_RegularMergePartners_ptr *)0x0) {
    pcStack_180 = std::
                  _Function_handler<void_(Block_*,_const_diy::ReduceProxy_&,_const_diy::RegularMergePartners_&),_void_(*)(Block_*,_const_diy::ReduceProxy_&,_const_diy::RegularMergePartners_&)>
                  ::_M_invoke;
    local_188 = std::
                _Function_handler<void_(Block_*,_const_diy::ReduceProxy_&,_const_diy::RegularMergePartners_&),_void_(*)(Block_*,_const_diy::ReduceProxy_&,_const_diy::RegularMergePartners_&)>
                ::_M_manager;
    local_198._M_unused._0_8_ = (undefined8)*local_148;
  }
  detail::ReductionFunctor<Block,_diy::RegularMergePartners>::ReductionFunctor
            (&local_138,(uint)local_1a8,(Callback *)&local_198,partners,local_140);
  local_168 = (code *)0x0;
  pcStack_160 = (code *)0x0;
  local_178._M_unused._M_object = (void *)0x0;
  local_178._8_8_ = 0;
  local_178._M_unused._M_object = operator_new(0x18);
  *(uint *)local_178._M_unused._0_8_ = (uint)local_1a8;
  *(RegularMergePartners **)((long)local_178._M_unused._0_8_ + 8) = partners;
  pcStack_160 = std::
                _Function_handler<bool_(int,_const_diy::Master_&),_diy::detail::SkipInactiveOr<diy::RegularMergePartners,_diy::detail::ReduceNeverSkip>_>
                ::_M_invoke;
  local_168 = std::
              _Function_handler<bool_(int,_const_diy::Master_&),_diy::detail::SkipInactiveOr<diy::RegularMergePartners,_diy::detail::ReduceNeverSkip>_>
              ::_M_manager;
  Master::foreach<diy::detail::ReductionFunctor<Block,diy::RegularMergePartners>>
            (master,&local_138,(Skip *)&local_178);
  if (local_168 != (code *)0x0) {
    (*local_168)(&local_178,&local_178,__destroy_functor);
  }
  if (local_138.partners.super_RegularPartners.steps_.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.partners.super_RegularPartners.steps_.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start,(long)local_138.partners.super_RegularPartners.steps_.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage -
                             (long)local_138.partners.super_RegularPartners.steps_.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start);
  }
  if (local_138.partners.super_RegularPartners.kvs_.
      super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.partners.super_RegularPartners.kvs_.
                    super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_138.partners.super_RegularPartners.kvs_.
                          super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.partners.super_RegularPartners.kvs_.
                          super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_138.partners.super_RegularPartners.divisions_.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(local_138.partners.super_RegularPartners.divisions_.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start,(long)local_138.partners.super_RegularPartners.divisions_.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage -
                             (long)local_138.partners.super_RegularPartners.divisions_.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start);
  }
  if (local_138.reduce.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_138.reduce.super__Function_base._M_manager)
              ((_Any_data *)&local_138.reduce,(_Any_data *)&local_138.reduce,__destroy_functor);
  }
  if (local_188 != (code *)0x0) {
    (*local_188)(&local_198,&local_198,__destroy_functor);
  }
  master->expected_ = local_154;
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_150);
  return;
}

Assistant:

void reduce(Master&                    master,        //!< master object
            const Assigner&            assigner,      //!< assigner object
            const Partners&            partners,      //!< partners object
            const Reduce&              reduce,        //!< reduction callback function
            const Skip&                skip)          //!< object determining whether a block should be skipped
{
  auto log = get_logger();

  int original_expected = master.expected();

  using Block = typename detail::block_traits<Reduce>::type;

  unsigned round;
  for (round = 0; round < partners.rounds(); ++round)
  {
    log->debug("Round {}", round);
    master.foreach(detail::ReductionFunctor<Block,Partners>(round, reduce, partners, assigner),
                   detail::SkipInactiveOr<Partners,Skip>(round, partners, skip));
    master.execute();

    int expected = 0;
    for (unsigned i = 0; i < master.size(); ++i)
    {
      if (partners.active(round + 1, master.gid(i), master))
      {
        std::vector<int> incoming_gids;
        partners.incoming(round + 1, master.gid(i), incoming_gids, master);
        expected += static_cast<int>(incoming_gids.size());
        master.incoming(master.gid(i)).clear();
      }
    }
    master.set_expected(expected);
    master.flush(false);
  }
  // final round
  log->debug("Round {}", round);
  master.foreach(detail::ReductionFunctor<Block,Partners>(round, reduce, partners, assigner),
                 detail::SkipInactiveOr<Partners,Skip>(round, partners, skip));

  master.set_expected(original_expected);
}